

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigRepr.c
# Opt level: O2

Aig_Man_t * Aig_ManDupReprBasic(Aig_Man_t *p)

{
  Aig_Man_t *p_00;
  void *pvVar1;
  int i;
  
  if (p->pReprs != (Aig_Obj_t **)0x0) {
    p_00 = Aig_ManDupRepr(p,0);
    Aig_ManSeqCleanupBasic(p_00);
    for (i = 0; i < p->vObjs->nSize; i = i + 1) {
      pvVar1 = Vec_PtrEntry(p->vObjs,i);
      if (((pvVar1 != (void *)0x0) && (*(long *)((long)pvVar1 + 0x28) != 0)) &&
         ((*(byte *)(*(long *)((long)pvVar1 + 0x28) + 0x18) & 7) == 0)) {
        *(undefined8 *)((long)pvVar1 + 0x28) = 0;
      }
    }
    return p_00;
  }
  __assert_fail("p->pReprs != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigRepr.c"
                ,0x148,"Aig_Man_t *Aig_ManDupReprBasic(Aig_Man_t *)");
}

Assistant:

Aig_Man_t * Aig_ManDupReprBasic( Aig_Man_t * p )
{
    Aig_Man_t * pNew;
    Aig_Obj_t * pObj;
    int i;
    assert( p->pReprs != NULL );
    // reconstruct AIG with representatives
    pNew = Aig_ManDupRepr( p, 0 );
    // perfrom sequential cleanup but do not remove registers
    Aig_ManSeqCleanupBasic( pNew );
    // remove pointers to the dead nodes
    Aig_ManForEachObj( p, pObj, i )
        if ( pObj->pData && Aig_ObjIsNone((Aig_Obj_t *)pObj->pData) )
            pObj->pData = NULL;
    return pNew;
}